

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O1

void __thiscall
SAT::explainUnlearnable(SAT *this,set<int,_std::less<int>,_std::allocator<int>_> *param_1)

{
  uint uVar1;
  Reason *pRVar2;
  Reason RVar3;
  Clause *pCVar4;
  Lit *pLVar5;
  char *pcVar6;
  vec<int> *this_00;
  anon_union_8_2_743a5d44_for_Reason_0 aVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  bool bVar15;
  Lit q;
  Lit p;
  vec<Lit> removed;
  Lit local_64;
  int local_60;
  Lit local_5c;
  vec<Lit> local_58;
  long local_40;
  vec<int> *local_38;
  undefined4 extraout_var;
  
  local_40 = std::chrono::_V2::steady_clock::now();
  local_58.sz = 0;
  local_58.cap = 0;
  local_58.data = (Lit *)0x0;
  if (1 < (this->out_learnt).sz) {
    local_38 = &this->out_learnt_level;
    uVar10 = 1;
    do {
      uVar1 = (this->out_learnt).data[uVar10].x;
      uVar13 = (int)uVar1 >> 1;
      local_5c.x = uVar1;
      if (((uint)(this->flags).data[uVar13] & 4) == 0) {
        pRVar2 = (this->reason).data;
        aVar7 = (anon_union_8_2_743a5d44_for_Reason_0)pRVar2[uVar13].field_0._pt;
        uVar9 = aVar7._0_4_ & 3;
        if ((aVar7._a & 3) != 0) {
          if (uVar9 == 1) {
            btToPos(this,this->index,(this->trailpos).data[uVar13]);
            RVar3.field_0 =
                 (anon_union_8_2_743a5d44_for_Reason_0)(this->reason).data[uVar13].field_0._a;
            aVar7._0_4_ = (*engine.propagators.data[(ulong)RVar3.field_0 >> 0x20]->_vptr_Propagator
                            [5])(engine.propagators.data[(ulong)RVar3.field_0 >> 0x20],
                                 (ulong)(uVar1 ^ 1),(ulong)RVar3.field_0 >> 2 & 0x3fffffff);
            aVar7._a._4_4_ = extraout_var;
          }
          else {
            pCVar4 = this->short_expl;
            *(uint *)pCVar4 = uVar9 << 8 | (uint)*(byte *)pCVar4;
            if (((ulong)aVar7 & 3) == 0 || uVar9 == 1) {
LAB_001c5715:
              abort();
            }
            *(uint *)(pCVar4 + 1) = *(uint *)&pRVar2[uVar13].field_0 >> 2;
            if (uVar9 == 3) {
              pCVar4[1].data[0].x = *(int *)((long)&pRVar2[uVar13].field_0 + 4);
            }
            aVar7 = (anon_union_8_2_743a5d44_for_Reason_0)this->short_expl;
          }
        }
        vec<Lit>::push(&local_58,&local_5c);
        this_00 = local_38;
        pLVar5 = (this->out_learnt).data;
        pLVar5[uVar10].x = pLVar5[(this->out_learnt).sz - 1].x;
        (this->out_learnt).sz = (this->out_learnt).sz - 1;
        (this->out_learnt_level).sz = (this->out_learnt_level).sz - 1;
        if (0x1ff < *(uint *)aVar7._pt) {
          uVar14 = 1;
          do {
            if (*(uint *)aVar7._pt >> 8 <= uVar14) goto LAB_001c5715;
            local_64.x = (aVar7._pt)->data[uVar14].x;
            pcVar6 = (this->seen).data;
            if (pcVar6[(uint)(local_64.x >> 1)] == '\0') {
              pcVar6[(uint)(local_64.x >> 1)] = '\x01';
              vec<Lit>::push(&this->out_learnt,&local_64);
              uVar12 = (ulong)engine.trail_lim.sz;
              iVar11 = engine.trail_lim.sz + 1;
              do {
                bVar15 = uVar12 == 0;
                uVar12 = uVar12 - 1;
                if (bVar15) {
                  iVar11 = 0;
                  break;
                }
                iVar11 = iVar11 + -1;
              } while ((this->trailpos).data[(uint)(local_64.x >> 1)] <
                       engine.trail_lim.data[uVar12]);
              local_60 = iVar11 + -1;
              if (iVar11 == 0) {
                local_60 = 0;
              }
              vec<int>::push(this_00,&local_60);
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 < *(uint *)aVar7._pt >> 8);
        }
      }
      else {
        uVar10 = uVar10 + 1;
      }
    } while (uVar10 < (this->out_learnt).sz);
  }
  if (local_58.sz != 0) {
    uVar14 = 0;
    do {
      (this->seen).data[(uint)(local_58.data[uVar14].x >> 1)] = '\0';
      uVar14 = uVar14 + 1;
    } while (uVar14 < (local_58._0_8_ & 0xffffffff));
  }
  lVar8 = std::chrono::_V2::steady_clock::now();
  (this->pushback_time).__r = (this->pushback_time).__r + (lVar8 - local_40) / 1000000;
  if (local_58.data != (Lit *)0x0) {
    free(local_58.data);
  }
  return;
}

Assistant:

void SAT::explainUnlearnable(std::set<int>& /*contributingNogoods*/) {
	const time_point start = chuffed_clock::now();

	vec<Lit> removed;
	for (unsigned int i = 1; i < out_learnt.size(); i++) {
		const Lit p = out_learnt[i];
		if (flags[var(p)].learnable()) {
			continue;
		}
		assert(!reason[var(p)].isLazy());
		Clause& c = *getExpl(~p);
		removed.push(p);
		out_learnt[i] = out_learnt.last();
		out_learnt.pop();
		out_learnt_level.pop();
		i--;
		for (unsigned int j = 1; j < c.size(); j++) {
			const Lit q = c[j];
			if (seen[var(q)] == 0) {
				seen[var(q)] = 1;
				out_learnt.push(q);
				out_learnt_level.push(getLevel(var(q)));
			}
		}
	}

	for (unsigned int i = 0; i < removed.size(); i++) {
		seen[var(removed[i])] = 0;
	}

	pushback_time += std::chrono::duration_cast<duration>(chuffed_clock::now() - start);
}